

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

uint Fossilize::default_get_member_uint(Value *value,char *member,uint default_value)

{
  bool bVar1;
  Value *this;
  Value *memb;
  uint default_value_local;
  char *member_local;
  Value *value_local;
  
  this = maybe_get_member(value,member);
  value_local._4_4_ = default_value;
  if ((this != (Value *)0x0) &&
     (bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsUint(this), bVar1)) {
    value_local._4_4_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetUint(this);
  }
  return value_local._4_4_;
}

Assistant:

static unsigned default_get_member_uint(const Value &value, const char *member, unsigned default_value = 0)
{
	auto *memb = maybe_get_member(value, member);
	if (!memb)
		return default_value;
	if (!memb->IsUint())
		return default_value;
	return memb->GetUint();
}